

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *cp)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016bc750;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016bc3a8,DestMesh,&cp->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016bc0a8;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016c3208;
  iVar1 = (cp->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[1];
  iVar2 = (cp->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[2];
  iVar3 = (cp->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[3];
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[0] =
       (cp->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[2] = iVar2;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[3] = iVar3;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoTetrahedra_016c3180;
  lVar4 = 0x78;
  do {
    *(undefined ***)((long)(&this->fGeo + -2) + lVar4) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar4 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar4 + -0x50) = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x1e0);
  for (lVar4 = 0x78; lVar4 != 0x1e0; lVar4 = lVar4 + 0x18) {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar4 + -0x50) =
         *(undefined8 *)
          ((long)(cp->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
          lVar4 + -0x50);
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar4 + -0x48) =
         *(undefined4 *)
          ((long)(cp->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
          lVar4 + -0x48);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}